

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeMultiSuccessorInfo *
Js::PathTypeMultiSuccessorInfo::New
          (PathTypeSuccessorKey key,RecyclerWeakReference<Js::DynamicType> *typeWeakRef,
          ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  PathTypeMultiSuccessorInfo *this;
  TrackAllocData local_48;
  ScriptContext *local_20;
  ScriptContext *scriptContext_local;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  PathTypeSuccessorKey key_local;
  
  local_20 = scriptContext;
  scriptContext_local = (ScriptContext *)typeWeakRef;
  typeWeakRef_local = (RecyclerWeakReference<Js::DynamicType> *)key;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0xc1);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (PathTypeMultiSuccessorInfo *)new<Memory::Recycler>(0x10,pRVar1,0x43c4b0);
  pRVar1 = ScriptContext::GetRecycler(local_20);
  PathTypeMultiSuccessorInfo
            (this,pRVar1,(PathTypeSuccessorKey)typeWeakRef_local,
             (RecyclerWeakReference<Js::DynamicType> *)scriptContext_local);
  return this;
}

Assistant:

PathTypeMultiSuccessorInfo * PathTypeMultiSuccessorInfo::New(const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeMultiSuccessorInfo, scriptContext->GetRecycler(), key, typeWeakRef);
    }